

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

void StatPrint(SuperLUStat_t *stat)

{
  double *pdVar1;
  flops_t *pfVar2;
  flops_t *ops;
  double *utime;
  SuperLUStat_t *stat_local;
  
  pdVar1 = stat->utime;
  pfVar2 = stat->ops;
  printf("Factor time  = %8.5f\n",pdVar1[7]);
  if ((pdVar1[7] != 0.0) || (NAN(pdVar1[7]))) {
    printf("Factor flops = %e\tMflops = %8.2f\n",(double)pfVar2[7]);
  }
  printf("Solve time   = %8.4f\n",pdVar1[0x11]);
  if ((pdVar1[0x11] != 0.0) || (NAN(pdVar1[0x11]))) {
    printf("Solve flops = %e\tMflops = %8.2f\n",(double)pfVar2[0x11],
           ((double)pfVar2[0x11] * 1e-06) / pdVar1[0x11]);
  }
  printf("Number of memory expansions: %d\n",(ulong)(uint)stat->expansions);
  return;
}

Assistant:

void
StatPrint(SuperLUStat_t *stat)
{
    double         *utime;
    flops_t        *ops;

    utime = stat->utime;
    ops   = stat->ops;
    printf("Factor time  = %8.5f\n", utime[FACT]);
    if ( utime[FACT] != 0.0 )
      printf("Factor flops = %e\tMflops = %8.2f\n", ops[FACT],
	     ops[FACT]*1e-6/utime[FACT]);

    printf("Solve time   = %8.4f\n", utime[SOLVE]);
    if ( utime[SOLVE] != 0.0 )
      printf("Solve flops = %e\tMflops = %8.2f\n", ops[SOLVE],
	     ops[SOLVE]*1e-6/utime[SOLVE]);

    printf("Number of memory expansions: %d\n", stat->expansions);

}